

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O3

void add_weapon_skill(int n)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
  iVar2 = 0;
  do {
    bVar1 = can_advance(iVar2,'\0');
    uVar4 = uVar4 + bVar1;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x2a);
  u.weapon_slots = u.weapon_slots + n;
  uVar3 = 0;
  iVar2 = 0;
  do {
    bVar1 = can_advance(iVar2,'\0');
    uVar3 = uVar3 + bVar1;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x2a);
  if (uVar4 < uVar3) {
    pline("You feel more confident in your %sskills.");
    nomul(0,(char *)0x0);
    return;
  }
  return;
}

Assistant:

void add_weapon_skill(int n)
{
    int i, before, after;

    for (i = 0, before = 0; i < P_NUM_SKILLS; i++)
	if (can_advance(i, FALSE)) before++;
    u.weapon_slots += n;
    for (i = 0, after = 0; i < P_NUM_SKILLS; i++)
	if (can_advance(i, FALSE)) after++;
    if (before < after)
	give_may_advance_msg(P_NONE);
}